

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

DebuggerScope * __thiscall
Js::ByteCodeWriter::RecordStartScopeObject
          (ByteCodeWriter *this,DiagExtraScopesType scopeType,RegSlot scopeLocation,int *index)

{
  code *pcVar1;
  bool bVar2;
  RegSlot scopeLocation_00;
  undefined4 *puVar3;
  DebuggerScope *debuggerScope;
  FunctionBody *this_00;
  
  if (scopeLocation == 0xffffffff) {
    scopeLocation_00 = 0xffffffff;
  }
  else {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
    }
    scopeLocation_00 = FunctionBody::MapRegSlot(this_00,scopeLocation);
  }
  debuggerScope =
       FunctionBody::RecordStartScopeObject
                 (this->m_functionWrite,scopeType,(this->m_byteCodeData).currentOffset,
                  scopeLocation_00,index);
  PushDebuggerScope(this,debuggerScope);
  return debuggerScope;
}

Assistant:

DebuggerScope* ByteCodeWriter::RecordStartScopeObject(DiagExtraScopesType scopeType, RegSlot scopeLocation, int* index)
    {
        if (scopeLocation != Js::Constants::NoRegister)
        {
            scopeLocation = ConsumeReg(scopeLocation);
        }
        DebuggerScope* debuggerScope = m_functionWrite->RecordStartScopeObject(scopeType, m_byteCodeData.GetCurrentOffset(), scopeLocation, index);
        PushDebuggerScope(debuggerScope);
        return debuggerScope;
    }